

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMap.c
# Opt level: O2

int * If_CutArrTimeProfile(If_Man_t *p,If_Cut_t *pCut)

{
  If_Obj_t *pIVar1;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < (byte)pCut->field_0x1f; uVar2 = uVar2 + 1) {
    pIVar1 = If_ManObj(p,(int)(&pCut[1].Area)[uVar2]);
    p->pArrTimeProfile[uVar2] = (int)(pIVar1->CutBest).Delay;
  }
  return p->pArrTimeProfile;
}

Assistant:

int * If_CutArrTimeProfile( If_Man_t * p, If_Cut_t * pCut )
{
    int i;
    for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        p->pArrTimeProfile[i] = (int)If_ObjCutBest(If_CutLeaf(p, pCut, i))->Delay;
    return p->pArrTimeProfile;
}